

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_trainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t parameters)

{
  ZDICT_params_t params;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t parameters_01;
  int iVar1;
  uint uVar2;
  undefined8 in_RDX;
  size_t in_RSI;
  U32 *in_RDI;
  int in_R8D;
  undefined8 unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 uStack0000000000000018;
  size_t in_stack_00000020;
  undefined4 in_stack_00000028;
  int in_stack_0000002c;
  undefined8 in_stack_00000030;
  size_t dictionarySize;
  size_t tail;
  size_t initVal;
  COVER_map_t activeDmers;
  COVER_ctx_t ctx;
  BYTE *dict;
  undefined4 uVar3;
  undefined4 uVar4;
  int displayLevel;
  undefined4 uVar5;
  undefined4 uVar6;
  double in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  size_t *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  COVER_ctx_t *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  COVER_map_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  U32 *pUVar7;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar8;
  
  uStack0000000000000018 = 0x3ff0000000000000;
  g_displayLevel = in_stack_0000002c;
  parameters_00.zParams.notificationLevel = in_stack_0000002c;
  parameters_00.zParams.compressionLevel = in_stack_00000028;
  uVar5 = 0;
  uVar6 = 0x3ff00000;
  uVar3 = (undefined4)in_stack_00000008;
  uVar4 = (undefined4)((ulong)in_stack_00000008 >> 0x20);
  displayLevel = (int)((ulong)in_stack_00000010 >> 0x20);
  parameters_00.steps = (int)in_stack_00000010;
  parameters_00._0_8_ = in_stack_00000008;
  parameters_00.nbThreads = displayLevel;
  parameters_00.splitPoint._0_4_ = 0;
  parameters_00.splitPoint._4_4_ = 0x3ff00000;
  parameters_00._24_8_ = in_stack_00000020;
  parameters_00._40_8_ = in_stack_00000030;
  pUVar7 = in_RDI;
  iVar1 = COVER_checkParameters(parameters_00,in_RSI);
  if (iVar1 == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Cover parameters incorrect\n");
      fflush(_stderr);
    }
    sVar8 = 0xffffffffffffffd6;
  }
  else if (in_R8D == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Cover must have at least one input file\n");
      fflush(_stderr);
    }
    sVar8 = 0xffffffffffffffb8;
  }
  else if (in_RSI < 0x100) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      fflush(_stderr);
    }
    sVar8 = 0xffffffffffffffba;
  }
  else {
    sVar8 = COVER_ctx_init(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    uVar2 = ZSTD_isError(0x290d3b);
    if (uVar2 == 0) {
      COVER_warnOnSmallCorpus(in_stack_00000020,CONCAT44(uVar6,uVar5),displayLevel);
      iVar1 = COVER_map_init((COVER_map_t *)CONCAT44(uVar4,uVar3),0);
      if (iVar1 == 0) {
        if (0 < g_displayLevel) {
          fprintf(_stderr,"Failed to allocate dmer map: out of memory\n");
          fflush(_stderr);
        }
        COVER_ctx_destroy((COVER_ctx_t *)0x290dc3);
        sVar8 = 0xffffffffffffffc0;
      }
      else {
        if (1 < g_displayLevel) {
          fprintf(_stderr,"Building dictionary\n");
          fflush(_stderr);
        }
        parameters_01.steps = (int)in_RSI;
        parameters_01.nbThreads = (int)(in_RSI >> 0x20);
        parameters_01.k = (int)in_RDX;
        parameters_01.d = (int)((ulong)in_RDX >> 0x20);
        parameters_01.splitPoint = (double)pUVar7;
        parameters_01.shrinkDict = (int)in_stack_fffffffffffffff8;
        parameters_01.shrinkDictMaxRegression = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
        parameters_01._40_8_ = in_stack_00000008;
        parameters_01.zParams._0_8_ = unaff_retaddr;
        COVER_buildDictionary
                  ((COVER_ctx_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RDI,
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   parameters_01);
        params.dictID = (uint)dictBufferCapacity;
        params._0_8_ = samplesBuffer;
        sVar8 = ZDICT_finalizeDictionary
                          ((void *)ctx._80_8_,(size_t)ctx.dmerAt,ctx.freqs,ctx.suffixSize,ctx.suffix
                           ,(size_t *)ctx.nbTestSamples,(uint)samplesSizes,params);
        uVar2 = ZSTD_isError(0x290ec3);
        if ((uVar2 == 0) && (1 < g_displayLevel)) {
          fprintf(_stderr,"Constructed dictionary of size %u\n",sVar8 & 0xffffffff);
          fflush(_stderr);
        }
        COVER_ctx_destroy((COVER_ctx_t *)0x290f0b);
        COVER_map_destroy((COVER_map_t *)0x290f15);
      }
    }
  }
  return sVar8;
}

Assistant:

ZDICTLIB_API size_t ZDICT_trainFromBuffer_cover(
    void *dictBuffer, size_t dictBufferCapacity,
    const void *samplesBuffer, const size_t *samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t parameters)
{
  BYTE* const dict = (BYTE*)dictBuffer;
  COVER_ctx_t ctx;
  COVER_map_t activeDmers;
  parameters.splitPoint = 1.0;
  /* Initialize global data */
  g_displayLevel = (int)parameters.zParams.notificationLevel;
  /* Checks */
  if (!COVER_checkParameters(parameters, dictBufferCapacity)) {
    DISPLAYLEVEL(1, "Cover parameters incorrect\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  /* Initialize context and activeDmers */
  {
    size_t const initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                      parameters.d, parameters.splitPoint);
    if (ZSTD_isError(initVal)) {
      return initVal;
    }
  }
  COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, g_displayLevel);
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    COVER_ctx_destroy(&ctx);
    return ERROR(memory_allocation);
  }

  DISPLAYLEVEL(2, "Building dictionary\n");
  {
    const size_t tail =
        COVER_buildDictionary(&ctx, ctx.freqs, &activeDmers, dictBuffer,
                              dictBufferCapacity, parameters);
    const size_t dictionarySize = ZDICT_finalizeDictionary(
        dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
        samplesBuffer, samplesSizes, nbSamples, parameters.zParams);
    if (!ZSTD_isError(dictionarySize)) {
      DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                   (unsigned)dictionarySize);
    }
    COVER_ctx_destroy(&ctx);
    COVER_map_destroy(&activeDmers);
    return dictionarySize;
  }
}